

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEnginePrivate::nativeHasPendingDatagrams(QNativeSocketEnginePrivate *this)

{
  ssize_t sVar1;
  int *piVar2;
  long in_FS_OFFSET;
  bool bVar3;
  char c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  c = -0x56;
  do {
    sVar1 = recv((int)this->socketDescriptor,&c,1,2);
    if (sVar1 != -1) {
      bVar3 = true;
      goto LAB_00217332;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  bVar3 = *piVar2 == 0x5a;
LAB_00217332:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeHasPendingDatagrams() const
{
    // Peek 1 bytes into the next message.
    ssize_t readBytes;
    char c;
    QT_EINTR_LOOP(readBytes, ::recv(socketDescriptor, &c, 1, MSG_PEEK));

    // If there's no error, or if our buffer was too small, there must be a
    // pending datagram.
    bool result = (readBytes != -1) || errno == EMSGSIZE;

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeHasPendingDatagrams() == %s",
           result ? "true" : "false");
#endif
    return result;
}